

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.h
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Parfait::StringTools::split
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *s,string *delimiter)

{
  char *pcVar1;
  pointer __haystack;
  string out;
  value_type local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __haystack = (s->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  while (pcVar1 = strstr(__haystack,(delimiter->_M_dataplus)._M_p), pcVar1 != (char *)0x0) {
    for (; __haystack != pcVar1; __haystack = __haystack + 1) {
      std::__cxx11::string::push_back((char)&local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_50);
    __haystack = __haystack + delimiter->_M_string_length;
    std::__cxx11::string::assign((char *)&local_50);
  }
  for (; *__haystack != '\0'; __haystack = __haystack + 1) {
    std::__cxx11::string::push_back((char)&local_50);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split(const std::string &s, const std::string &delimiter) {
        std::vector<std::string> elements;
        auto src = s.c_str();
        const char *next = src;
        std::string out;
        while ((next = strstr(src, delimiter.c_str())) != NULL) {
            while (src != next)
                out += *src++;
            elements.push_back(out);
            src += delimiter.size();
            out = "";
        }

        while (*src != '\0')
            out += *src++;
        elements.push_back(out);
        return elements;
    }